

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O1

void __thiscall
myEmployeeBoss::myEmployeeBoss(myEmployeeBoss *this,int m_age,double m_wages,bool m_is_dumb)

{
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"John","");
  (this->super_myEmployee)._vptr_myEmployee = (_func_int **)&PTR__myEmployee_00158370;
  (this->super_myEmployee).age = m_age;
  (this->super_myEmployee).wages = m_wages;
  (this->super_myEmployee).body = ATHLETIC;
  (this->super_myEmployee).name._M_dataplus._M_p = (pointer)&(this->super_myEmployee).name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_myEmployee).name,local_50,local_48 + (long)local_50);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  (this->super_myEmployee)._vptr_myEmployee = (_func_int **)&PTR__myEmployeeBoss_00158338;
  this->is_dumb = m_is_dumb;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"John","");
  (this->slave)._vptr_myEmployee = (_func_int **)&PTR__myEmployee_00158370;
  (this->slave).age = 0x15;
  (this->slave).wages = 300.0;
  (this->slave).body = ATHLETIC;
  (this->slave).name._M_dataplus._M_p = (pointer)&(this->slave).name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->slave).name,local_70,local_68 + (long)local_70);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return;
}

Assistant:

myEmployeeBoss(int m_age = 38, double m_wages = 9000.4, bool m_is_dumb = true)
        : myEmployee(m_age, m_wages), 
        is_dumb(m_is_dumb),
        slave(21, 300){}